

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O2

void __thiscall AbstractTxIn_IsCoinBaseTest_Test::TestBody(AbstractTxIn_IsCoinBaseTest_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertHelper AStack_228;
  string local_220;
  AssertionResult gtest_ar__2;
  Txid empty_txid;
  AbstractTxIn not_coinbase;
  AssertionResult gtest_ar_;
  AbstractTxIn coinbase_input;
  
  cfd::core::ByteData256::ByteData256((ByteData256 *)&coinbase_input);
  cfd::core::Txid::Txid(&empty_txid,(ByteData256 *)&coinbase_input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&coinbase_input);
  cfd::core::AbstractTxIn::AbstractTxIn(&coinbase_input,&empty_txid,0xffffffff,0xffffffff);
  gtest_ar_.success_ = cfd::core::AbstractTxIn::IsCoinBase(&coinbase_input);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&not_coinbase,(internal *)&gtest_ar_,
               (AssertionResult *)"coinbase_input.IsCoinBase()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x80,(char *)not_coinbase._vptr_AbstractTxIn);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_220,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_220);
    std::__cxx11::string::~string((string *)&not_coinbase);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::AbstractTxIn::AbstractTxIn(&not_coinbase,&empty_txid,0xffffffff,0);
  cfd::core::AbstractTxIn::operator=(&coinbase_input,&not_coinbase);
  cfd::core::AbstractTxIn::~AbstractTxIn(&not_coinbase);
  gtest_ar_.success_ = cfd::core::AbstractTxIn::IsCoinBase(&coinbase_input);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&not_coinbase,(internal *)&gtest_ar_,
               (AssertionResult *)"coinbase_input.IsCoinBase()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_220,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x84,(char *)not_coinbase._vptr_AbstractTxIn);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_220,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_220);
    std::__cxx11::string::~string((string *)&not_coinbase);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::AbstractTxIn::AbstractTxIn(&not_coinbase,&empty_txid,0,0xffffffff);
  bVar1 = cfd::core::AbstractTxIn::IsCoinBase(&not_coinbase);
  gtest_ar__2.success_ = !bVar1;
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"not_coinbase.IsCoinBase()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x88,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&AStack_228,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&AStack_228);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_220);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  std::__cxx11::string::string
            ((string *)&local_220,"0d2a5386ec4fe2afb6fbf31b5d51781645ba8bd4a56daa1e7645bd4c4c4646d9"
             ,(allocator *)&AStack_228);
  cfd::core::Txid::Txid((Txid *)&gtest_ar__2,&local_220);
  cfd::core::AbstractTxIn::AbstractTxIn
            ((AbstractTxIn *)&gtest_ar_,(Txid *)&gtest_ar__2,0xffffffff,0xffffffff);
  cfd::core::AbstractTxIn::operator=(&not_coinbase,(AbstractTxIn *)&gtest_ar_);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)&gtest_ar_);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar__2);
  std::__cxx11::string::~string((string *)&local_220);
  bVar1 = cfd::core::AbstractTxIn::IsCoinBase(&not_coinbase);
  gtest_ar__2.success_ = !bVar1;
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,
               (AssertionResult *)"not_coinbase.IsCoinBase()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x8d,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&AStack_228,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&AStack_228);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_220);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  cfd::core::AbstractTxIn::~AbstractTxIn(&not_coinbase);
  cfd::core::AbstractTxIn::~AbstractTxIn(&coinbase_input);
  cfd::core::Txid::~Txid(&empty_txid);
  return;
}

Assistant:

TEST(AbstractTxIn, IsCoinBaseTest) {
  const Txid empty_txid = Txid(ByteData256());
  const uint32_t max_vout = std::numeric_limits<uint32_t>::max();
  const uint32_t sequence = 4294967295;
  AbstractTxIn coinbase_input = AbstractTxIn(
    empty_txid, max_vout, sequence);
  EXPECT_TRUE(coinbase_input.IsCoinBase());

  coinbase_input = AbstractTxIn(
    empty_txid, max_vout, 0);
  EXPECT_TRUE(coinbase_input.IsCoinBase());

  AbstractTxIn not_coinbase = AbstractTxIn(
    empty_txid, 0, sequence);
  EXPECT_FALSE(not_coinbase.IsCoinBase());

  not_coinbase = AbstractTxIn(
    Txid("0d2a5386ec4fe2afb6fbf31b5d51781645ba8bd4a56daa1e7645bd4c4c4646d9"),
    max_vout, sequence);
  EXPECT_FALSE(not_coinbase.IsCoinBase());
}